

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O3

void __thiscall QFbCursor::changeCursor(QFbCursor *this,QCursor *widgetCursor,QWindow *window)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QRect QVar4;
  undefined8 local_58;
  undefined8 local_50;
  QRect local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this[0x10] == (QFbCursor)0x1) {
    if ((widgetCursor == (QCursor *)0x0) || (iVar2 = QCursor::shape(), iVar2 != 0x18)) {
      if (*(long *)(this + 0x48) != 0) {
        QPlatformCursorImage::set((CursorShape)*(long *)(this + 0x48));
      }
    }
    else {
      iVar2 = QCursor::hotSpot();
      QCursor::pixmap();
      QPixmap::toImage();
      if (*(QImage **)(this + 0x48) != (QImage *)0x0) {
        QPlatformCursorImage::set(*(QImage **)(this + 0x48),(int)&local_40,iVar2);
      }
      QImage::~QImage((QImage *)&local_40);
      QPixmap::~QPixmap((QPixmap *)&local_58);
    }
    QVar4 = getCurrentRect(this);
    *(QRect *)(this + 0x20) = QVar4;
    uVar3 = (**(code **)(**(long **)(this + 0x18) + 0x68))();
    if (this[0x41] == (QFbCursor)0x0) {
      local_40 = (QRect)(**(code **)(**(long **)(this + 0x18) + 0x68))();
      iVar2 = (int)((ulong)uVar3 >> 0x20);
      local_58 = CONCAT44(*(int *)(this + 0x24) + iVar2,*(int *)(this + 0x20) + (int)uVar3);
      local_50 = CONCAT44(iVar2 + *(int *)(this + 0x2c),*(int *)(this + 0x28) + (int)uVar3);
      cVar1 = QRect::intersects(&local_40);
      if (cVar1 == '\0') goto LAB_0011c061;
    }
    (**(code **)(*(long *)this + 0xa0))(this);
  }
LAB_0011c061:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFbCursor::changeCursor(QCursor * widgetCursor, QWindow *window)
{
    Q_UNUSED(window);
    if (!mVisible)
        return;
    const Qt::CursorShape shape = widgetCursor ? widgetCursor->shape() : Qt::ArrowCursor;

    if (shape == Qt::BitmapCursor) {
        // application supplied cursor
        QPoint spot = widgetCursor->hotSpot();
        setCursor(widgetCursor->pixmap().toImage(), spot.x(), spot.y());
    } else {
        // system cursor
        setCursor(shape);
    }
    mCurrentRect = getCurrentRect();
    QPoint mScreenOffset = mScreen->geometry().topLeft(); // global to local translation
    if (mOnScreen || mScreen->geometry().intersects(mCurrentRect.translated(mScreenOffset)))
        setDirty();
}